

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

void dump_status(void)

{
  FILE *__stream;
  uint uVar1;
  int j;
  uint local_4;
  
  for (local_4 = 0; __stream = _stdout, (int)local_4 < 0xfe; local_4 = local_4 + 1) {
    if ((addr[(int)local_4].flags != 0) || (addr[(int)local_4].name != 0)) {
      uVar1 = addr_status_mine(local_4);
      fprintf(__stream,"%02x: %c",(ulong)local_4,(ulong)uVar1);
      if (addr[(int)local_4].name == 0) {
        fprintf(_stdout," -");
      }
      else {
        fprintf(_stdout," %016llx",addr[(int)local_4].name);
      }
      fprintf(_stdout,"\n");
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

static void dump_status(void)
{
	int j;

	for (j = 0; j < J1939_IDLE_ADDR; ++j) {
		if (!addr[j].flags && !addr[j].name)
			continue;
		fprintf(stdout, "%02x: %c", j, addr_status_mine(j));
		if (addr[j].name)
			fprintf(stdout, " %016llx", (long long)addr[j].name);
		else
			fprintf(stdout, " -");
		fprintf(stdout, "\n");
	}
	fflush(stdout);
}